

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

BoolExpr * BO_or(List *ls)

{
  BoolExprStruct **ppBVar1;
  BoolExprStruct *pBVar2;
  bool bVar3;
  bool bVar4;
  BoolExpr *pBVar5;
  BoolExpr *pBVar6;
  ListStruct *ls_00;
  
  pBVar5 = (BoolExpr *)malloc(0x18);
  pBVar5->type = E_OR;
  ppBVar1 = &pBVar5->subexpr;
  pBVar5->subexpr = (BoolExprStruct *)0x0;
  pBVar5->next = (BoolExprStruct *)0x0;
  ls_00 = ls->cdr;
  if (ls_00 == (ListStruct *)0x0) {
    bVar3 = true;
  }
  else {
    bVar4 = false;
    do {
      pBVar6 = make_boolean_expr(ls_00);
      bVar3 = true;
      if (pBVar6->type != E_FALSE) {
        if (pBVar6->type == E_TRUE) {
          return &true_bool_expr;
        }
        pBVar6->next = *ppBVar1;
        *ppBVar1 = pBVar6;
        bVar3 = bVar4;
      }
      ls_00 = ls_00->cdr;
      bVar4 = bVar3;
    } while (ls_00 != (ListStruct *)0x0);
    bVar3 = !bVar3;
  }
  pBVar2 = *ppBVar1;
  if (pBVar2 == (BoolExprStruct *)0x0) {
    pBVar5 = &false_bool_expr;
    if (bVar3) {
      parse_error((List *)0x0,"or takes arguments!\n");
    }
  }
  else if (pBVar2->next == (BoolExprStruct *)0x0) {
    pBVar5 = pBVar2;
  }
  return pBVar5;
}

Assistant:

static BoolExpr *
BO_or (const List *ls)
{
  BOOL hit_false = FALSE;
  BoolExpr *subexpr, *ret;

  ret = create_bool_expr (E_OR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	return &true_bool_expr;
      if (subexpr->type == E_FALSE)  /* No sense adding in FALSE statements*/
	hit_false = TRUE;
      else
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
    }
  if (ret->subexpr == NULL)
    {
      if (hit_false)   /* If we hit nothing but FALSE's return FALSE */
	return &false_bool_expr;
      parse_error(ls, "or takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (or a) == a */
    return ret->subexpr;
  
  return ret;
}